

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EtherCATStack.cpp
# Opt level: O3

void tEcJobTask(void *pvThreadParamDesc)

{
  EC_T_DWORD EVar1;
  bool bVar2;
  byte bVar3;
  CAtEmLogging *pCVar4;
  int iVar5;
  uint uVar6;
  EC_T_DWORD EVar7;
  uint uVar8;
  uint uVar9;
  EC_T_BYTE *pEVar10;
  EC_T_BYTE *pEVar11;
  ulong uVar12;
  undefined8 uVar13;
  sbyte sVar14;
  EC_T_DWORD EVar15;
  short sVar16;
  uint uVar17;
  EC_T_DWORD EVar18;
  uint uVar19;
  byte bVar20;
  uint uVar21;
  char *szFormat;
  byte *pbVar22;
  EC_T_BOOL bPrevCycProcessed;
  EC_T_CHAR *pszLog;
  undefined2 local_62;
  uint local_60;
  int local_5c;
  ulong local_58;
  int local_4c;
  void *local_48;
  long local_40;
  EC_T_CHAR *local_38;
  
  local_5c = 0;
  iVar5 = OsSetThreadAffinity(0,1 << (*(byte *)((long)pvThreadParamDesc + 0x18) & 0x1f));
  if (iVar5 == 0) {
    CAtEmLogging::LogError
              (S_poLog,"Error: Set job task affinitiy, invalid CPU index %d\n",
               (ulong)*(uint *)((long)pvThreadParamDesc + 0x18));
    return;
  }
  *(undefined4 *)((long)pvThreadParamDesc + 4) = 1;
  local_58 = 0;
  local_48 = pvThreadParamDesc;
  do {
    OsWaitForEvent(*(undefined8 *)((long)pvThreadParamDesc + 0x10),0xffffffff);
    ecatPerfMeasEnd(&S_TscMeasDesc,4);
    ecatPerfMeasStart(&S_TscMeasDesc,4);
    ecatPerfMeasStart(&S_TscMeasDesc,0);
    uVar6 = emExecJob(0,1,&local_5c);
    pCVar4 = S_poLog;
    if (((uVar6 == 0x9811000e) || (uVar6 == 0x9811002d)) || (uVar6 == 0)) {
      ecatPerfMeasEnd(&S_TscMeasDesc,0);
      if (uVar6 == 0) {
        iVar5 = (int)local_58;
        if (local_5c == 0) {
          if (iVar5 < 0x28) {
            szFormat = 
            "eUsrJob_ProcessAllRxFrames - not all previously sent frames are received/processed (frame loss)!"
            ;
          }
          else {
            szFormat = "Error: System overload: Cycle time too short or huge jitter!";
          }
          CAtEmLogging::LogError(S_poLog,szFormat);
          local_58 = (ulong)(iVar5 + 10);
        }
        else {
          local_58 = (ulong)(iVar5 - (uint)(0 < iVar5));
        }
      }
    }
    else {
      uVar13 = ecatGetText(uVar6);
      CAtEmLogging::LogError
                (pCVar4,"ERROR: ecatExecJob( eUsrJob_ProcessAllRxFrames): %s (0x%lx)",uVar13,
                 (ulong)uVar6);
      ecatPerfMeasEnd(&S_TscMeasDesc,0);
    }
    ecatPerfMeasStart(&S_TscMeasDesc,6);
    local_38 = (EC_T_CHAR *)0x0;
    emDcmGetLog(0,&local_38);
    if (local_38 != (EC_T_CHAR *)0x0) {
      CAtEmLogging::LogDcm(S_poLog,local_38);
    }
    ecatPerfMeasEnd(&S_TscMeasDesc,6);
    ecatPerfMeasStart(&S_TscMeasDesc,5);
    iVar5 = *(int *)(*(long *)((long)pvThreadParamDesc + 0x28) + 0x7738);
    pEVar10 = (EC_T_BYTE *)emGetProcessImageInputPtr(0);
    pEVar11 = (EC_T_BYTE *)emGetProcessImageOutputPtr(0);
    if (callbackFct == (_func_void_EC_T_BYTE_ptr_EC_T_BYTE_ptr *)0x0) {
      CAtEmLogging::LogError(S_poLog,"callbackFct is not defined");
    }
    else {
      (*callbackFct)(pEVar10,pEVar11);
    }
    myAppWorkpd(CAtEmLogging*,int,unsigned_char*,unsigned_char*)::s_dwWorkpdCnt =
         myAppWorkpd(CAtEmLogging*,int,unsigned_char*,unsigned_char*)::s_dwWorkpdCnt + 1;
    if (((uint)(myAppWorkpd(CAtEmLogging*,int,unsigned_char*,unsigned_char*)::s_dwWorkpdCnt *
               -0x3d70a3d7) >> 2 |
        myAppWorkpd(CAtEmLogging*,int,unsigned_char*,unsigned_char*)::s_dwWorkpdCnt * 0x40000000) <
        0x28f5c29) {
      uVar12 = (ulong)S_dwSlaveIdx14;
      if (pEVar10 == (EC_T_BYTE *)0x0 || uVar12 == 0xffff) {
LAB_001457f7:
        bVar20 = 0;
      }
      else {
        EVar1 = S_aSlaveList[uVar12].dwPdOffsIn;
        if (EVar1 == 0xffffffff) goto LAB_001457f7;
        EVar18 = S_aSlaveList[uVar12].dwPdSizeIn;
        if (EVar18 == 0) {
          uVar6 = 0;
        }
        else {
          EVar7 = 8;
          if ((int)EVar18 < 8) {
            EVar7 = EVar18;
          }
          EVar15 = EVar1 + 7;
          if (-1 < (int)EVar1) {
            EVar15 = EVar1;
          }
          if ((int)(EVar18 + EVar1) < 9) {
            uVar6 = (uint)pEVar10[(int)EVar15 >> 3];
          }
          else {
            uVar6 = (uint)*(ushort *)(pEVar10 + ((int)EVar15 >> 3));
          }
          uVar6 = uVar6 >> ((byte)EVar1 & 7) & ~(-1 << ((byte)EVar7 & 0x1f));
          local_62 = CONCAT11(local_62._1_1_,(char)uVar6);
          if (EVar18 - EVar7 != 0 && (int)EVar7 <= (int)EVar18) {
            uVar9 = EVar7 + EVar1;
            pbVar22 = (byte *)((long)&local_62 + 1);
            uVar8 = EVar18 - EVar7;
            do {
              uVar17 = 8;
              if (uVar8 < 8) {
                uVar17 = uVar8;
              }
              bVar20 = (byte)(-1 << ((byte)uVar17 & 0x1f));
              *pbVar22 = *pbVar22 & bVar20 |
                         (~bVar20 | 1) &
                         (byte)(*(ushort *)(pEVar10 + ((uVar9 & 0xffff) >> 3)) >> ((byte)uVar9 & 7))
              ;
              uVar9 = (uVar9 & 0xffff) + uVar17;
              pbVar22 = pbVar22 + 1;
              uVar21 = uVar8 - uVar17;
              bVar2 = (int)uVar17 <= (int)uVar8;
              uVar8 = uVar21;
            } while (uVar21 != 0 && bVar2);
          }
        }
        bVar20 = (byte)uVar6;
        if (3 < iVar5) {
          if (bVar20 != myAppWorkpd(CAtEmLogging*,int,unsigned_char*,unsigned_char*)::
                        s_byDigInputLastVal) {
            CAtEmLogging::LogMsg
                      (S_poLog,"Input Value updated : Old : 0x%x -> New : 0x%x",
                       (ulong)myAppWorkpd(CAtEmLogging*,int,unsigned_char*,unsigned_char*)::
                              s_byDigInputLastVal,(ulong)(uVar6 & 0xff));
            myAppWorkpd(CAtEmLogging*,int,unsigned_char*,unsigned_char*)::s_byDigInputLastVal =
                 bVar20;
          }
        }
      }
      uVar12 = (ulong)S_dwSlaveIdx24;
      if (pEVar11 != (EC_T_BYTE *)0x0 && uVar12 != 0xffff) {
        uVar6 = S_aSlaveList[uVar12].dwPdOffsOut;
        if ((uVar6 != 0xffffffff) && (EVar1 = S_aSlaveList[uVar12].dwPdSizeOut, EVar1 != 0)) {
          EVar18 = 8;
          if ((int)EVar1 < 8) {
            EVar18 = EVar1;
          }
          uVar8 = uVar6 + 7;
          if (-1 < (int)uVar6) {
            uVar8 = uVar6;
          }
          local_40 = (long)((int)uVar8 >> 3);
          local_4c = -1 << ((byte)EVar18 & 0x1f);
          if ((int)(EVar1 + uVar6) < 9) {
            local_60 = CONCAT31((int3)(EVar1 + uVar6 >> 8),pEVar11[local_40]);
            uVar8 = (uint)pEVar11[local_40];
          }
          else {
            uVar8 = (uint)*(ushort *)(pEVar11 + local_40);
            local_60 = (uint)*(ushort *)(pEVar11 + local_40);
          }
          sVar14 = (sbyte)(uVar6 & 7);
          if (EVar1 - EVar18 != 0 && (int)EVar18 <= (int)EVar1) {
            uVar17 = EVar18 + uVar6;
            pbVar22 = (byte *)((long)&local_62 + 1);
            uVar9 = EVar1 - EVar18;
            do {
              uVar21 = 8;
              if (uVar9 < 8) {
                uVar21 = uVar9;
              }
              bVar3 = (byte)(-1 << ((byte)uVar21 & 0x1f));
              *pbVar22 = *pbVar22 & bVar3 |
                         (~bVar3 | 1) &
                         (byte)(*(ushort *)(pEVar11 + ((uVar17 & 0xffff) >> 3)) >>
                               ((byte)uVar17 & 7));
              uVar17 = (uVar17 & 0xffff) + uVar21;
              pbVar22 = pbVar22 + 1;
              uVar19 = uVar9 - uVar21;
              bVar2 = (int)uVar21 <= (int)uVar9;
              uVar9 = uVar19;
            } while (uVar19 != 0 && bVar2);
          }
          bVar20 = (bVar20 & (byte)local_4c | (byte)(uVar8 >> sVar14) & ~(byte)local_4c) + 1;
          EVar18 = 8 - (uVar6 & 7);
          if ((int)EVar1 <= (int)EVar18) {
            EVar18 = EVar1;
          }
          local_62 = CONCAT11(local_62._1_1_,bVar20);
          uVar6 = ~(-1 << ((byte)EVar18 & 0x1f));
          if ((int)EVar1 < 9) {
            uVar8 = (uint)bVar20;
          }
          else {
            uVar8 = (uint)local_62;
          }
          pEVar11[local_40] =
               (byte)((uVar8 & uVar6) << sVar14) | ~(byte)(uVar6 << sVar14) & (byte)local_60;
          pvThreadParamDesc = local_48;
          if (EVar1 - EVar18 != 0 && (int)EVar18 <= (int)EVar1) {
            pbVar22 = pEVar11 + local_40;
            uVar6 = EVar1 - EVar18;
            do {
              pbVar22 = pbVar22 + 1;
              uVar8 = 8;
              if (uVar6 < 8) {
                uVar8 = uVar6;
              }
              bVar20 = (byte)(-1 << ((byte)uVar8 & 0x1f));
              *pbVar22 = *pbVar22 & bVar20 | (~bVar20 | 1) & (byte)(local_62 >> ((byte)EVar18 & 7));
              EVar18 = EVar18 + uVar8;
              uVar9 = uVar6 - uVar8;
              bVar2 = (int)uVar8 <= (int)uVar6;
              uVar6 = uVar9;
            } while (uVar9 != 0 && bVar2);
          }
        }
      }
      if (((ulong)S_dwSlaveIdx4132 != 0xffff && pEVar11 != (EC_T_BYTE *)0x0) &&
         (uVar6 = S_aSlaveList[S_dwSlaveIdx4132].dwPdOffsOut, uVar6 != 0xffffffff)) {
        *(short *)(pEVar11 + (uVar6 >> 3)) = *(short *)(pEVar11 + (uVar6 >> 3)) + 1;
        *(short *)(pEVar11 + (uVar6 + 0x10 >> 3)) = *(short *)(pEVar11 + (uVar6 + 0x10 >> 3)) + -1;
      }
      uVar12 = (ulong)S_dwSlaveIdxETCio100;
      if (uVar12 != 0xffff && pEVar11 != (EC_T_BYTE *)0x0) {
        if (S_aSlaveList[uVar12].dwPdOffsOut != 0xffffffff) {
          pEVar11[S_aSlaveList[uVar12].dwPdOffsOut >> 3] =
               pEVar11[S_aSlaveList[uVar12].dwPdOffsOut >> 3] + '\x01';
          EVar1 = S_aSlaveList[uVar12].dwPdOffsOut;
          if (EVar1 != 0xffffffff) {
            uVar6 = EVar1 + 8 >> 3;
            sVar16 = *(short *)(pEVar11 + uVar6) + 0x100;
            if (0xfff < (ushort)(*(short *)(pEVar11 + uVar6) + 0x100U)) {
              sVar16 = 0;
            }
            *(short *)(pEVar11 + uVar6) = sVar16;
            uVar6 = EVar1 + 0x18 >> 3;
            sVar16 = *(short *)(pEVar11 + uVar6) + -0x100;
            if (0xfff < (ushort)(*(short *)(pEVar11 + uVar6) - 0x100U)) {
              sVar16 = 0xf00;
            }
            *(short *)(pEVar11 + uVar6) = sVar16;
          }
        }
      }
    }
    ecatPerfMeasEnd(&S_TscMeasDesc,5);
    ecatPerfMeasStart(&S_TscMeasDesc,1);
    uVar6 = emExecJob(0,2,0);
    pCVar4 = S_poLog;
    if (((uVar6 != 0x9811000e) && (uVar6 != 0x9811002d)) && (uVar6 != 0)) {
      uVar13 = ecatGetText(uVar6);
      CAtEmLogging::LogError
                (pCVar4,"ecatExecJob( eUsrJob_SendAllCycFrames,    EC_NULL ): %s (0x%lx)",uVar13,
                 (ulong)uVar6);
    }
    ecatPerfMeasEnd(&S_TscMeasDesc,1);
    if (uVar6 == 0x98110038) {
      bRun = 0;
    }
    ecatPerfMeasStart(&S_TscMeasDesc,2);
    uVar6 = emExecJob(0,4,0);
    pCVar4 = S_poLog;
    if ((uVar6 != 0x9811000e) && (uVar6 != 0)) {
      uVar13 = ecatGetText(uVar6);
      CAtEmLogging::LogError
                (pCVar4,"ecatExecJob(eUsrJob_MasterTimer, EC_NULL): %s (0x%lx)",uVar13,(ulong)uVar6)
      ;
    }
    ecatPerfMeasEnd(&S_TscMeasDesc,2);
    ecatPerfMeasStart(&S_TscMeasDesc,3);
    uVar6 = emExecJob(0,6,0);
    pCVar4 = S_poLog;
    if (((uVar6 != 0x9811000e) && (uVar6 != 0x9811002d)) && (uVar6 != 0)) {
      uVar13 = ecatGetText(uVar6);
      CAtEmLogging::LogError
                (pCVar4,"ecatExecJob(eUsrJob_SendAcycFrames, EC_NULL): %s (0x%lx)",uVar13,
                 (ulong)uVar6);
    }
    ecatPerfMeasEnd(&S_TscMeasDesc,3);
    if (*(int *)((long)pvThreadParamDesc + 8) != 0) {
      ecatPerfMeasShow(&S_TscMeasDesc,0xffffffff,S_aszMeasInfo);
      *(undefined4 *)((long)pvThreadParamDesc + 4) = 0;
      return;
    }
  } while( true );
}

Assistant:

static EC_T_VOID tEcJobTask(EC_T_VOID* pvThreadParamDesc)
{
    EC_T_DWORD           dwRes             = EC_E_ERROR;
    T_DEMO_THREAD_PARAM* pDemoThreadParam  = (T_DEMO_THREAD_PARAM*)pvThreadParamDesc;
    EC_T_CPUSET          CpuSet;
    EC_T_BOOL            bPrevCycProcessed = EC_FALSE;
    EC_T_INT             nOverloadCounter  = 0;               /* counter to check if cycle time is to short */
    EC_T_BOOL            bOk;

    EC_CPUSET_ZERO(CpuSet);
    EC_CPUSET_SET(CpuSet, pDemoThreadParam->dwCpuIndex);
    bOk = OsSetThreadAffinity(EC_NULL, CpuSet);
    if (!bOk)
    {
        LogError("Error: Set job task affinitiy, invalid CPU index %d\n", pDemoThreadParam->dwCpuIndex);
        goto Exit;
    }

    /* Start periodic task right before where it is used,
     * otherwise, OsSleepTillTick() might fail if this thread is suspended before being able to call OsMakeThreadPeriodic() */
#if (defined XENOMAI)
    OsMakeThreadPeriodic(rt_task_self(), pDemoThreadParam->dwBusCycleTimeUsec);
#endif

    /* demo loop */
    pDemoThreadParam->bJobThreadRunning = EC_TRUE;
    do
    {
        /* wait for next cycle (event from scheduler task) */
#if (defined RTAI) || (defined XENOMAI)
        OsSleepTillTick(); /* period is set after creating jobtask */
#else
        OsWaitForEvent(pDemoThreadParam->pvTimingEvent, EC_WAITINFINITE);
#endif /* !RTAI && !XENOMAI*/

        PERF_JOB_END(PERF_CycleTime);
        PERF_JOB_START(PERF_CycleTime);

        /* process all received frames (read new input values) */
        PERF_JOB_START(JOB_ProcessAllRxFrames);
        dwRes = ecatExecJob(eUsrJob_ProcessAllRxFrames, &bPrevCycProcessed);
        if (EC_E_NOERROR != dwRes && EC_E_INVALIDSTATE != dwRes && EC_E_LINK_DISCONNECTED != dwRes)
        {
            LogError("ERROR: ecatExecJob( eUsrJob_ProcessAllRxFrames): %s (0x%lx)", ecatGetText(dwRes), dwRes);
        }
        PERF_JOB_END(JOB_ProcessAllRxFrames);

        if (EC_E_NOERROR == dwRes)
        {
            if (!bPrevCycProcessed)
            {
                /* it is not reasonable, that more than 5 continuous frames are lost */
                nOverloadCounter += 10;
                if (nOverloadCounter >= 50)
                {
                    LogError( "Error: System overload: Cycle time too short or huge jitter!" );
                }
                else
                {
                    LogError( "eUsrJob_ProcessAllRxFrames - not all previously sent frames are received/processed (frame loss)!" );
                }
            }
            else
            {
                /* everything o.k.? If yes, decrement overload counter */
                if (nOverloadCounter > 0)    nOverloadCounter--;
            }
        }
        /* handle DCM logging */
#ifdef DCM_ENABLE_LOGFILE
        PERF_JOB_START(PERF_DCM_Logfile);
        {
            EC_T_CHAR* pszLog = EC_NULL;

            ecatDcmGetLog(&pszLog);
            if (EC_NULL != pszLog)
            {
                LogDcm(pszLog);
            }
        }
        PERF_JOB_END(PERF_DCM_Logfile);
#endif

        /*****************************************************/
        /* Demo code: Remove/change this in your application: Working process data cyclic call */
        /*****************************************************/
        PERF_JOB_START(PERF_myAppWorkpd);
        myAppWorkpd(pDemoThreadParam->pLogInst, pDemoThreadParam->pNotInst->Verbose(), ecatGetProcessImageInputPtr(), ecatGetProcessImageOutputPtr());
        PERF_JOB_END(PERF_myAppWorkpd);

        /* write output values of current cycle, by sending all cyclic frames */
        PERF_JOB_START(JOB_SendAllCycFrames);
        dwRes = ecatExecJob( eUsrJob_SendAllCycFrames, EC_NULL );
        if (EC_E_NOERROR != dwRes && EC_E_INVALIDSTATE != dwRes && EC_E_LINK_DISCONNECTED != dwRes)
        {
            LogError("ecatExecJob( eUsrJob_SendAllCycFrames,    EC_NULL ): %s (0x%lx)", ecatGetText(dwRes), dwRes);
        }
        PERF_JOB_END(JOB_SendAllCycFrames);

        /* remove this code when using licensed version */
        if (EC_E_EVAL_EXPIRED == dwRes )
        {
            bRun = EC_FALSE;        /* set shutdown flag */
        }

        /* Execute some administrative jobs. No bus traffic is performed by this function */
        PERF_JOB_START(JOB_MasterTimer);
        dwRes = ecatExecJob(eUsrJob_MasterTimer, EC_NULL);
        if (EC_E_NOERROR != dwRes && EC_E_INVALIDSTATE != dwRes)
        {
            LogError("ecatExecJob(eUsrJob_MasterTimer, EC_NULL): %s (0x%lx)", ecatGetText(dwRes), dwRes);
        }
        PERF_JOB_END(JOB_MasterTimer);

        /* send queued acyclic EtherCAT frames */
        PERF_JOB_START(JOB_SendAcycFrames);
        dwRes = ecatExecJob(eUsrJob_SendAcycFrames, EC_NULL);
        if (EC_E_NOERROR != dwRes && EC_E_INVALIDSTATE != dwRes && EC_E_LINK_DISCONNECTED != dwRes)
        {
            LogError("ecatExecJob(eUsrJob_SendAcycFrames, EC_NULL): %s (0x%lx)", ecatGetText(dwRes), dwRes);
        }
        PERF_JOB_END(JOB_SendAcycFrames);

#if !(defined NO_OS)
    } while (!pDemoThreadParam->bJobThreadShutdown);

    PERF_MEASURE_JOBS_SHOW();

    pDemoThreadParam->bJobThreadRunning = EC_FALSE;
#else
    /* in case of NO_OS the job task function is called cyclically within the timer ISR */
    }